

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QMetaType::registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>
               (MutableViewFunction *view,QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  int iVar2;
  QMetaType in_RSI;
  long in_FS_OFFSET;
  anon_class_16_2_c632c92a_for_m_func *in_stack_ffffffffffffff98;
  MutableViewFunction *in_stack_ffffffffffffffb0;
  bool local_39;
  QMetaType from;
  
  from.d_ptr = *(QMetaTypeInterface **)(in_FS_OFFSET + 0x28);
  bVar1 = registerMutableViewFunction(in_stack_ffffffffffffffb0,from,in_RSI);
  if (bVar1) {
    if (registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
        ::unregister == '\0') {
      iVar2 = __cxa_guard_acquire(&registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                                   ::unregister);
      if (iVar2 != 0) {
        qScopeGuard<QMetaType::registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)::_lambda()_1_>
                  (in_stack_ffffffffffffff98);
        __cxa_atexit(QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:688:56)>
                     ::~QScopeGuard,
                     &registerMutableViewImpl<QList<QPersistentModelIndex>,_QIterable<QMetaSequence>_>
                      ::unregister,&__dso_handle);
        __cxa_guard_release(&registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                             ::unregister);
      }
    }
    local_39 = true;
  }
  else {
    local_39 = false;
  }
  if (*(QMetaTypeInterface **)(in_FS_OFFSET + 0x28) == from.d_ptr) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }